

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Block::rewriteAsCanonicalUnreachableContinue(Block *this,Block *header)

{
  bool bVar1;
  Id id;
  size_type sVar2;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_28;
  Instruction *local_20;
  Instruction *branch;
  Block *header_local;
  Block *this_local;
  
  branch = (Instruction *)header;
  header_local = this;
  bVar1 = std::
          vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
          ::empty(&this->localVariables);
  if (!bVar1) {
    __assert_fail("localVariables.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0x126,"void spv::Block::rewriteAsCanonicalUnreachableContinue(Block *)");
  }
  sVar2 = std::
          vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
          ::size(&this->instructions);
  if (sVar2 != 0) {
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::resize(&this->instructions,1);
    std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::clear(&this->successors);
    if (branch != (Instruction *)0x0) {
      this_00 = (Instruction *)::operator_new(0x60);
      spv::Instruction::Instruction(this_00,OpBranch);
      local_20 = this_00;
      id = getId((Block *)branch);
      spv::Instruction::addIdOperand(this_00,id);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_28,
                 local_20);
      addInstruction(this,&local_28);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_28);
      std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::push_back
                (&this->successors,(value_type *)&branch);
      return;
    }
    __assert_fail("header != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,300,"void spv::Block::rewriteAsCanonicalUnreachableContinue(Block *)");
  }
  __assert_fail("instructions.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,0x128,"void spv::Block::rewriteAsCanonicalUnreachableContinue(Block *)");
}

Assistant:

void rewriteAsCanonicalUnreachableContinue(Block* header) {
        assert(localVariables.empty());
        // Delete all instructions except for the label.
        assert(instructions.size() > 0);
        instructions.resize(1);
        successors.clear();
        // Add OpBranch back to the header.
        assert(header != nullptr);
        Instruction* branch = new Instruction(OpBranch);
        branch->addIdOperand(header->getId());
        addInstruction(std::unique_ptr<Instruction>(branch));
        successors.push_back(header);
    }